

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gb_tick_envelope(SOUND *snd)

{
  char cVar1;
  INT8 new_envelope_value;
  SOUND *snd_local;
  
  if ((((snd->envelope_enabled & 1U) != 0) &&
      (snd->envelope_count = snd->envelope_count - 1 & 7, snd->envelope_count == '\0')) &&
     (snd->envelope_count = snd->envelope_time, snd->envelope_count != '\0')) {
    cVar1 = snd->envelope_value + snd->envelope_direction;
    if ((cVar1 < '\0') || ('\x0f' < cVar1)) {
      snd->envelope_enabled = false;
    }
    else {
      snd->envelope_value = cVar1;
    }
  }
  return;
}

Assistant:

static void gb_tick_envelope(struct SOUND *snd)
{
	if (snd->envelope_enabled)
	{
		snd->envelope_count = (snd->envelope_count - 1) & 0x07;

		if (snd->envelope_count == 0)
		{
			snd->envelope_count = snd->envelope_time;

			if (snd->envelope_count)
			{
				INT8 new_envelope_value = snd->envelope_value + snd->envelope_direction;

				if (new_envelope_value >= 0 && new_envelope_value <= 15)
				{
					snd->envelope_value = new_envelope_value;
				}
				else
				{
					snd->envelope_enabled = false;
				}
			}
		}
	}
}